

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

StatementSyntax * __thiscall
slang::parsing::Parser::parseAssertionStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token finalKeyword;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  logic_t lVar4;
  ConcurrentAssertionStatementSyntax *pCVar5;
  SourceLocation location;
  DeferredAssertionSyntax *delay;
  ExpressionSyntax *expression;
  ParenthesizedExpressionSyntax *expr;
  ActionBlockSyntax *action;
  ImmediateAssertionStatementSyntax *pIVar6;
  SyntaxKind SVar7;
  char cVar8;
  Token zero_00;
  Token TVar9;
  Token TVar10;
  Token hash;
  Token keyword;
  Token zero;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_108;
  uint uStack_100;
  undefined1 uStack_fc;
  byte bStack_fb;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  byte local_eb;
  SyntaxKind local_e4;
  Info *local_e0;
  Token local_d8;
  undefined8 local_c8;
  pointer local_c0;
  size_t local_b8;
  NamedLabelSyntax *local_b0;
  Token local_a8;
  undefined1 local_98 [16];
  SyntaxNode *local_88;
  SyntaxNode *pSStack_80;
  size_t local_78;
  pointer local_70;
  __extent_storage<18446744073709551615UL> local_68;
  _func_int **local_60;
  Info *local_58;
  Token local_50;
  Token local_40;
  
  TVar9 = ParserBase::peek(&this->super_ParserBase,1);
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  if (TVar10.kind == CoverKeyword) {
    if ((TVar9._0_4_ & 0xffff) == 0x112) goto LAB_00441454;
    SVar7 = ImmediateCoverStatement;
  }
  else if (TVar10.kind == AssumeKeyword) {
    SVar7 = ImmediateAssumeStatement;
  }
  else {
    SVar7 = ImmediateAssertStatement;
  }
  if ((TVar9._0_4_ & 0xffff) == 0xf0) {
LAB_00441454:
    pCVar5 = parseConcurrentAssertion(this,label,attributes);
    return &pCVar5->super_StatementSyntax;
  }
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_d8.info = TVar9.info;
  bVar3 = ParserBase::peek(&this->super_ParserBase,Hash);
  local_e4 = SVar7;
  local_c8 = TVar9._0_8_;
  local_c0 = attributes._M_ptr;
  local_b8 = attributes._M_extent._M_extent_value._M_extent_value;
  local_b0 = label;
  if (bVar3) {
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    local_e0 = TVar9.info;
    local_d8._0_8_ = TVar9._0_8_;
    TVar9 = ParserBase::expect(&this->super_ParserBase,IntegerLiteral);
    local_98 = (undefined1  [16])TVar9;
    Token::intValue((Token *)&local_f8);
    bStack_fb = 0;
    local_108.val._0_6_ = 0;
    local_108.val._6_2_ = 0;
    uStack_fc = 1;
    uStack_100 = 1;
    SVInt::clearUnusedBits((SVInt *)&local_108);
    lVar4 = SVInt::operator==((SVInt *)&local_f8,(SVInt *)&local_108);
    if ((TVar9._0_4_ >> 0x10 & 1) == 0) {
      cVar8 = lVar4.value == '\0';
      if (lVar4.value == '@') {
        cVar8 = -0x80;
      }
      if (lVar4.value == 0x80) {
        cVar8 = -0x80;
      }
      bVar3 = cVar8 != '\0' && (cVar8 != '@' && cVar8 != -0x80);
    }
    else {
      bVar3 = false;
    }
    if (((0x40 < uStack_100) || ((bStack_fb & 1) != 0)) &&
       ((void *)CONCAT26(local_108.val._6_2_,local_108.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(local_108.val._6_2_,local_108.val._0_6_));
    }
    if (((0x40 < local_f0) || ((local_eb & 1) != 0)) && ((void *)local_f8.val != (void *)0x0)) {
      operator_delete__(local_f8.pVal);
    }
    if (bVar3) {
      location = Token::location((Token *)local_98);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x1b0005,location);
    }
    uVar1 = local_98._0_8_;
    uVar2 = local_98._8_8_;
    Token::Token(&local_40);
    local_60 = (_func_int **)uVar1;
    local_50.info = local_e0;
    local_50._0_8_ = local_d8._0_8_;
    local_58 = (Info *)uVar2;
  }
  else {
    bVar3 = ParserBase::peek(&this->super_ParserBase,FinalKeyword);
    if (!bVar3) {
      delay = (DeferredAssertionSyntax *)0x0;
      goto LAB_00441684;
    }
    Token::Token(&local_50);
    Token::Token((Token *)&local_60);
    local_a8 = ParserBase::consume(&this->super_ParserBase);
    local_40._0_8_ = local_a8._0_8_;
    local_40.info = local_a8.info;
  }
  finalKeyword.info = local_40.info;
  finalKeyword.kind = local_40.kind;
  finalKeyword._2_1_ = local_40._2_1_;
  finalKeyword.numFlags.raw = local_40.numFlags.raw;
  finalKeyword.rawLen = local_40.rawLen;
  zero_00.info = local_58;
  zero_00._0_8_ = local_60;
  hash.info = local_50.info;
  hash.kind = local_50.kind;
  hash._2_1_ = local_50._2_1_;
  hash.numFlags.raw = local_50.numFlags.raw;
  hash.rawLen = local_50.rawLen;
  delay = slang::syntax::SyntaxFactory::deferredAssertion(&this->factory,hash,zero_00,finalKeyword);
LAB_00441684:
  TVar9 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expression = parseExpression(this);
  TVar10 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  expr = slang::syntax::SyntaxFactory::parenthesizedExpression
                   (&this->factory,TVar9,expression,TVar10);
  action = parseActionBlock(this);
  local_98._8_4_ = 1;
  local_88 = (SyntaxNode *)0x0;
  pSStack_80 = (SyntaxNode *)0x0;
  local_78 = local_b8;
  local_70 = local_c0;
  local_68._M_extent_value = local_b8;
  local_98._0_8_ = &PTR_getChild_00698d40;
  keyword.info = local_d8.info;
  keyword.kind = (undefined2)local_c8;
  keyword._2_1_ = local_c8._2_1_;
  keyword.numFlags.raw = local_c8._3_1_;
  keyword.rawLen = local_c8._4_4_;
  pIVar6 = slang::syntax::SyntaxFactory::immediateAssertionStatement
                     (&this->factory,local_e4,local_b0,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_98,keyword,delay,
                      expr,action);
  return &pIVar6->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseAssertionStatement(NamedLabelSyntax* label, AttrList attributes) {
    // figure out what kind of assertion we're looking at; concurrent assertions
    // are involved and get their own handling
    SyntaxKind assertionKind = SyntaxKind::Unknown;
    TokenKind nextKind = peek(1).kind;
    switch (peek().kind) {
        case TokenKind::AssertKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssertStatement;
            break;
        case TokenKind::AssumeKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssumeStatement;
            break;
        case TokenKind::CoverKeyword:
            if (nextKind == TokenKind::PropertyKeyword || nextKind == TokenKind::SequenceKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateCoverStatement;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    Token keyword = consume();
    DeferredAssertionSyntax* deferred = nullptr;
    if (peek(TokenKind::Hash)) {
        auto hash = consume();
        auto zero = expect(TokenKind::IntegerLiteral);
        if (!zero.isMissing() && zero.intValue() != 0)
            addDiag(diag::DeferredDelayMustBeZero, zero.location());
        deferred = &factory.deferredAssertion(hash, zero, Token());
    }
    else if (peek(TokenKind::FinalKeyword)) {
        deferred = &factory.deferredAssertion(Token(), Token(), consume());
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto& parenExpr = factory.parenthesizedExpression(openParen, expr,
                                                      expect(TokenKind::CloseParenthesis));
    auto& actionBlock = parseActionBlock();
    return factory.immediateAssertionStatement(assertionKind, label, attributes, keyword, deferred,
                                               parenExpr, actionBlock);
}